

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::Import::~Import(Import *this)

{
  pointer pcVar1;
  
  this->_vptr_Import = (_func_int **)&PTR__Import_0019c890;
  pcVar1 = (this->field_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->field_name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->module_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->module_name).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Import() = default;